

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

BeginImplFrameArgs_TimestampsInUs * __thiscall
perfetto::protos::gen::BeginImplFrameArgs_TimestampsInUs::operator=
          (BeginImplFrameArgs_TimestampsInUs *this,BeginImplFrameArgs_TimestampsInUs *param_1)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  
  this->deadline_ = param_1->deadline_;
  iVar1 = param_1->interval_delta_;
  iVar2 = param_1->now_to_deadline_delta_;
  iVar3 = param_1->frame_time_to_now_delta_;
  iVar4 = param_1->frame_time_to_deadline_delta_;
  iVar5 = param_1->frame_time_;
  this->now_ = param_1->now_;
  this->frame_time_ = iVar5;
  this->frame_time_to_now_delta_ = iVar3;
  this->frame_time_to_deadline_delta_ = iVar4;
  this->interval_delta_ = iVar1;
  this->now_to_deadline_delta_ = iVar2;
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool BeginImplFrameArgs_TimestampsInUs::operator==(const BeginImplFrameArgs_TimestampsInUs& other) const {
  return unknown_fields_ == other.unknown_fields_
   && interval_delta_ == other.interval_delta_
   && now_to_deadline_delta_ == other.now_to_deadline_delta_
   && frame_time_to_now_delta_ == other.frame_time_to_now_delta_
   && frame_time_to_deadline_delta_ == other.frame_time_to_deadline_delta_
   && now_ == other.now_
   && frame_time_ == other.frame_time_
   && deadline_ == other.deadline_;
}